

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O1

uint64_t blech32_polymod_step(uint64_t pre)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = pre >> 0x37;
  uVar4 = 0;
  uVar5 = 0x5e8dbf1a03950c;
  if ((uVar1 & 2) == 0) {
    uVar5 = uVar4;
  }
  uVar3 = 0x1c3a3c74072a18;
  if ((uVar1 & 4) == 0) {
    uVar3 = uVar4;
  }
  uVar6 = 0x385d72fa0e5139;
  if ((uVar1 & 8) == 0) {
    uVar6 = uVar4;
  }
  uVar2 = 0x7093e5a608865b;
  if ((uVar1 & 0x10) == 0) {
    uVar2 = uVar4;
  }
  return uVar2 ^ uVar6 ^ uVar3 ^
                 uVar5 ^ (long)(pre << 8) >> 0x3f & 0x7d52fba40bd886U ^
                         (pre & 0x7fffffffffffff) << 5;
}

Assistant:

static uint64_t blech32_polymod_step(uint64_t pre) {
    uint8_t b = pre >> 55;
    return ((pre & 0x7fffffffffffffULL) << 5) ^
           (-((b >> 0) & 1) & 0x7d52fba40bd886ULL) ^
           (-((b >> 1) & 1) & 0x5e8dbf1a03950cULL) ^
           (-((b >> 2) & 1) & 0x1c3a3c74072a18ULL) ^
           (-((b >> 3) & 1) & 0x385d72fa0e5139ULL) ^
           (-((b >> 4) & 1) & 0x7093e5a608865bULL);
}